

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

float Abc_NtkGetArea(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Abc_Obj_t *pObj_00;
  int local_28;
  float local_24;
  int i;
  float Counter;
  Abc_Obj_t *pObj;
  If_LibLut_t *pLutLib;
  Abc_Ntk_t *pNtk_local;
  
  local_24 = 0.0;
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcPrint.c"
                  ,0xd8,"float Abc_NtkGetArea(Abc_Ntk_t *)");
  }
  pvVar3 = Abc_FrameReadLibLut();
  if ((pvVar3 != (void *)0x0) &&
     (iVar1 = *(int *)((long)pvVar3 + 8), iVar2 = Abc_NtkGetFaninMax(pNtk), iVar2 <= iVar1)) {
    for (local_28 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_28 < iVar1; local_28 = local_28 + 1)
    {
      pObj_00 = Abc_NtkObj(pNtk,local_28);
      if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
        iVar1 = Abc_ObjFaninNum(pObj_00);
        local_24 = *(float *)((long)pvVar3 + (long)iVar1 * 4 + 0x10) + local_24;
      }
    }
  }
  return local_24;
}

Assistant:

float Abc_NtkGetArea( Abc_Ntk_t * pNtk )
{
    If_LibLut_t * pLutLib;
    Abc_Obj_t * pObj;
    float Counter = 0.0;
    int i;
    assert( Abc_NtkIsLogic(pNtk) );
    // get the library
    pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    if ( pLutLib && pLutLib->LutMax >= Abc_NtkGetFaninMax(pNtk) )
    {
        Abc_NtkForEachNode( pNtk, pObj, i )
            Counter += pLutLib->pLutAreas[Abc_ObjFaninNum(pObj)];
    }
    return Counter;
}